

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O2

void __thiscall helics::Publication::publish(Publication *this,double val,string *units)

{
  __type_conflict1 _Var1;
  uint64_t match_flags;
  InvalidConversion *this_00;
  string_view message;
  precise_unit pVar2;
  precise_unit punit;
  string local_30;
  
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)units
                          ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &this->pubUnits);
  if (_Var1) {
    publish(this,val);
  }
  std::__cxx11::string::string
            ((string *)&local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)units);
  match_flags = ::units::getDefaultFlags();
  pVar2 = ::units::unit_from_string(&local_30,match_flags);
  punit = pVar2;
  std::__cxx11::string::~string((string *)&local_30);
  if (pVar2.base_units_ != (unit_data)0xfa94a488 || !NAN(pVar2.multiplier_)) {
    publish(this,val,&punit);
    return;
  }
  this_00 = (InvalidConversion *)__cxa_allocate_exception(0x28);
  message._M_str = "unable to perform the requested conversion";
  message._M_len = 0x2a;
  InvalidConversion::InvalidConversion(this_00,message);
  __cxa_throw(this_00,&InvalidConversion::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void Publication::publish(double val, const std::string& units)
{
    if (units == pubUnits) {
        publish(val);
    }
    auto punit = units::unit_from_string(units);
    if (units::is_valid(punit)) {
        publish(val, punit);
    } else {
        throw(InvalidConversion{});
    }
}